

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_X(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  iVar2 = width * 2;
  iVar9 = 0;
  if (height < 1) {
    height = iVar9;
  }
  while (iVar9 != height) {
    iVar9 = iVar9 + 1;
    bVar1 = tab_auc_dir_dxdy[0][mode][1];
    iVar6 = tab_auc_dir_dxdy[0][mode][0] * iVar9;
    iVar3 = iVar6 >> (bVar1 & 0x1f);
    iVar6 = (iVar6 * 0x20 >> (bVar1 & 0x1f)) + iVar3 * -0x20;
    uVar5 = (iVar2 - iVar3) + 1;
    if (width <= iVar2 - iVar3) {
      uVar5 = width;
    }
    lVar8 = (long)iVar3;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      dst[uVar7] = (pel)((uint)src[uVar7 + lVar8 + 2] * (iVar6 + 0x20) +
                         (uint)src[uVar7 + lVar8 + 1] * (0x40 - iVar6) +
                         (uint)src[uVar7 + lVar8] * (0x20 - iVar6) +
                         (uint)src[uVar7 + lVar8 + 3] * iVar6 + 0x40 >> 7);
    }
    if ((int)uVar5 < 1) {
      *dst = (pel)((iVar6 + 0x20) * (uint)src[(long)iVar2 + 2] +
                   (0x40 - iVar6) * (uint)src[(long)iVar2 + 1] + (0x20 - iVar6) * (uint)src[iVar2] +
                   iVar6 * (uint)src[(long)iVar2 + 3] + 0x40 >> 7);
      uVar5 = 1;
    }
    for (; (long)uVar4 < (long)width; uVar4 = uVar4 + 1) {
      dst[uVar4] = dst[uVar5 - 1];
    }
    dst = dst + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    int offset;
    int width2 = width << 1;

    for (j = 0; j < height; j++) {
        int c1, c2, c3, c4;
        int idx = getContextPixel(mode, 0, j + 1, &offset);
        int pred_width = COM_MIN(width, width2 - idx + 1);

        c1 = 32 - offset;
        c2 = 64 - offset;
        c3 = 32 + offset;
        c4 = offset;

        for (i = 0; i < pred_width; i++, idx++) {
            dst[i] = (src[idx] * c1 + src[idx + 1] * c2 + src[idx + 2] * c3 + src[idx + 3] * c4 + 64) >> 7;
        }
        if (pred_width <= 0) {
            dst[0] = (src[width2] * c1 + src[width2 + 1] * c2 + src[width2 + 2] * c3 + src[width2 + 3] * c4 + 64) >> 7;
            pred_width = 1;
        }
        for (; i < width; i++) {
            dst[i] = dst[pred_width - 1];
        }
        dst += i_dst;
    }
}